

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int i;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  Vector<float,_3> *pVVar5;
  int col;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  float fVar10;
  Vector<float,_3> res_1;
  Matrix<float,_3,_2> res;
  Type in0;
  int aiStack_18 [6];
  long lVar8;
  
  pfVar1 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pfVar4 = (float *)&in0;
    bVar9 = true;
    do {
      bVar2 = bVar9;
      lVar6 = 0;
      auVar7 = _DAT_00ada920;
      do {
        bVar9 = SUB164(auVar7 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                SUB164(auVar7 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar9) {
          fVar10 = 1.0;
          if (lVar3 != lVar6) {
            fVar10 = 0.0;
          }
          pfVar4[lVar6 * 2] = fVar10;
        }
        if (bVar9) {
          fVar10 = 1.0;
          if (lVar3 + -1 != lVar6) {
            fVar10 = 0.0;
          }
          pfVar4[lVar6 * 2 + 2] = fVar10;
        }
        lVar6 = lVar6 + 2;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
      } while (lVar6 != 4);
      lVar3 = 1;
      pfVar4 = pfVar1;
      bVar9 = false;
    } while (bVar2);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    lVar3 = 0;
    pfVar4 = (float *)&in0;
    bVar9 = true;
    do {
      bVar2 = bVar9;
      lVar6 = 0;
      do {
        pfVar4[lVar6 * 2] = *(float *)((long)&s_constInMat3x2 + lVar3 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar3 = 0xc;
      pfVar4 = pfVar1;
      bVar9 = false;
    } while (bVar2);
  }
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[2] = 0.0;
  lVar3 = 0;
  do {
    fVar10 = 1.0;
    if (lVar3 != 0) {
      fVar10 = 0.0;
    }
    res.m_data.m_data[0].m_data[lVar3] = fVar10;
    fVar10 = 1.0;
    if (lVar3 != 1) {
      fVar10 = 0.0;
    }
    res.m_data.m_data[1].m_data[lVar3] = fVar10;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pVVar5 = (Vector<float,_3> *)&res;
  pfVar4 = (float *)&in0;
  bVar9 = true;
  do {
    bVar2 = bVar9;
    lVar3 = 0;
    do {
      pVVar5->m_data[lVar3] = pfVar4[lVar3 * 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pVVar5 = res.m_data.m_data + 1;
    pfVar4 = pfVar1;
    bVar9 = false;
  } while (bVar2);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = res.m_data.m_data[0].m_data[lVar3] + res.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = res_1.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}